

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::inverseDynamicsInertialParametersRegressor
          (KinDynComputations *this,Vector6 *baseAcc,VectorDynSize *s_ddot,MatrixDynSize *regressor)

{
  FrameVelocityRepresentation FVar1;
  KinDynComputationsPrivateAttributes *pKVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  Index size;
  Transform *inertial_H_body;
  Twist *bodyFixedVel;
  Rotation *inertial_R_body;
  SpatialAcc *this_00;
  undefined1 (*pauVar7) [16];
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  PointerType pdVar11;
  long lVar12;
  Position *pPVar13;
  ulong uVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  PointerType ptr;
  long lVar20;
  Matrix6x6 B_A_X_A;
  type tmp;
  SpatialAcc *local_258 [2];
  PointerType local_248;
  variable_if_dynamic<long,__1> local_240;
  variable_if_dynamic<long,__1> local_238;
  PointerType local_230;
  variable_if_dynamic<long,__1> local_228;
  variable_if_dynamic<long,__1> local_220;
  variable_if_dynamic<long,__1> local_210;
  variable_if_dynamic<long,__1> vStack_208;
  long local_200;
  SpatialAcc local_1f8 [6];
  undefined8 *local_d8 [12];
  Rotation local_78 [72];
  
  computeFwdKinematics(this);
  pKVar2 = this->pimpl;
  if (pKVar2->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION) {
    inertial_H_body = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    convertInertialAccelerationToBodyFixedAcceleration(local_1f8,baseAcc,inertial_H_body);
    pKVar2 = this->pimpl;
  }
  else {
    if (pKVar2->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
      dVar4 = baseAcc->m_data[1];
      local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[0] = baseAcc->m_data[2];
      local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[1] = baseAcc->m_data[3];
      local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      linearVec3.super_Vector3.m_data[2] = baseAcc->m_data[4];
      local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
      angularVec3.super_Vector3.m_data[0] = baseAcc->m_data[5];
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
           baseAcc->m_data[0];
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = dVar4;
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
           local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
           .linearVec3.super_Vector3.m_data[0];
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
           local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
           .linearVec3.super_Vector3.m_data[1];
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
           local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
           .linearVec3.super_Vector3.m_data[2];
      (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
      super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
           local_1f8[0].super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
           .angularVec3.super_Vector3.m_data[0];
      goto LAB_001140a3;
    }
    bodyFixedVel = (Twist *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    inertial_R_body = (Rotation *)iDynTree::Transform::getRotation();
    convertMixedAccelerationToBodyFixedAcceleration(local_1f8,baseAcc,bodyFixedVel,inertial_R_body);
    pKVar2 = this->pimpl;
  }
  iDynTree::SpatialAcc::operator=(&pKVar2->m_invDynBaseAcc,local_1f8);
LAB_001140a3:
  pKVar2 = this->pimpl;
  this_00 = (SpatialAcc *)iDynTree::FreeFloatingAcc::baseAcc();
  iDynTree::SpatialAcc::operator=(this_00,&pKVar2->m_invDynBaseAcc);
  pKVar2 = this->pimpl;
  pauVar7 = (undefined1 (*) [16])iDynTree::FreeFloatingAcc::baseAcc();
  dVar4 = (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
          super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] -
          (pKVar2->m_gravityAccInBaseLinkFrame).m_data[1];
  auVar3._8_4_ = SUB84(dVar4,0);
  auVar3._0_8_ = (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
                 super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data
                 [0] - (pKVar2->m_gravityAccInBaseLinkFrame).m_data[0];
  auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *pauVar7 = auVar3;
  *(double *)pauVar7[1] =
       (pKVar2->m_invDynBaseAcc).super_SpatialMotionVector.
       super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] -
       (pKVar2->m_gravityAccInBaseLinkFrame).m_data[2];
  lVar8 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  iDynTree::FreeFloatingAcc::jointAcc();
  uVar9 = iDynTree::VectorDynSize::data();
  uVar10 = iDynTree::VectorDynSize::size();
  uVar14 = uVar10;
  if (((uVar9 & 7) == 0) && (uVar14 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar10 <= (long)uVar14)
     ) {
    uVar14 = uVar10;
  }
  lVar17 = uVar10 - uVar14;
  if (0 < (long)uVar14) {
    uVar19 = 0;
    do {
      *(undefined8 *)(uVar9 + uVar19 * 8) = *(undefined8 *)(lVar8 + uVar19 * 8);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  uVar19 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
  if (1 < lVar17) {
    do {
      puVar15 = (undefined8 *)(lVar8 + uVar14 * 8);
      uVar5 = puVar15[1];
      puVar16 = (undefined8 *)(uVar9 + uVar14 * 8);
      *puVar16 = *puVar15;
      puVar16[1] = uVar5;
      uVar14 = uVar14 + 2;
    } while ((long)uVar14 < (long)uVar19);
  }
  if ((long)uVar19 < (long)uVar10) {
    do {
      *(undefined8 *)(uVar9 + uVar19 * 8) = *(undefined8 *)(lVar8 + uVar19 * 8);
      uVar19 = uVar19 + 1;
    } while (uVar10 != uVar19);
  }
  pKVar2 = this->pimpl;
  iDynTree::ForwardAccKinematics
            (&pKVar2->m_robot_model,&pKVar2->m_traversal,&pKVar2->m_pos,&pKVar2->m_vel,
             &pKVar2->m_invDynGeneralizedProperAccs,&pKVar2->m_linkVel,
             &pKVar2->m_invDynLinkProperAccs);
  pKVar2 = this->pimpl;
  iDynTree::InverseDynamicsInertialParametersRegressor
            (&pKVar2->m_robot_model,&pKVar2->m_traversal,&pKVar2->m_linkPos,&pKVar2->m_linkVel,
             &pKVar2->m_invDynLinkProperAccs,regressor);
  FVar1 = this->pimpl->m_frameVelRepr;
  if (FVar1 != INERTIAL_FIXED_REPRESENTATION) {
    if (FVar1 == BODY_FIXED_REPRESENTATION) {
      iVar6 = iDynTree::MatrixDynSize::cols();
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::inverse();
      iDynTree::Transform::asAdjointTransformWrench();
      pdVar11 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar8 = iDynTree::MatrixDynSize::rows();
      local_220.m_value = iDynTree::MatrixDynSize::cols();
      lVar20 = (long)iVar6;
      local_258[0] = local_1f8;
      local_240.m_value = 6;
      local_210.m_value = 0;
      vStack_208.m_value = 0;
      local_248 = pdVar11;
      local_238.m_value = lVar20;
      local_230 = pdVar11;
      local_228.m_value = lVar8;
      local_200 = local_220.m_value;
      lVar8 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar17 = iDynTree::MatrixDynSize::cols();
      Eigen::Matrix<double,6,-1,0,6,-1>::
      Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,0>>
                ((Matrix<double,6,_1,0,6,_1> *)local_d8,
                 (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                  *)local_258);
      lVar12 = 0;
      puVar15 = local_d8[0];
      do {
        if (0 < lVar20) {
          lVar18 = 0;
          puVar16 = puVar15;
          do {
            *(undefined8 *)(lVar8 + lVar18 * 8) = *puVar16;
            lVar18 = lVar18 + 1;
            puVar16 = puVar16 + 6;
          } while (lVar20 != lVar18);
        }
        lVar12 = lVar12 + 1;
        puVar15 = puVar15 + 1;
        lVar8 = lVar8 + lVar17 * 8;
      } while (lVar12 != 6);
    }
    else {
      iVar6 = iDynTree::MatrixDynSize::cols();
      iDynTree::Rotation::Identity();
      iDynTree::FreeFloatingPos::worldBasePos();
      pPVar13 = (Position *)iDynTree::Transform::getPosition();
      iDynTree::Transform::Transform((Transform *)local_d8,local_78,pPVar13);
      iDynTree::Transform::inverse();
      iDynTree::Transform::asAdjointTransformWrench();
      pdVar11 = (PointerType)iDynTree::MatrixDynSize::data();
      lVar8 = iDynTree::MatrixDynSize::rows();
      local_220.m_value = iDynTree::MatrixDynSize::cols();
      lVar20 = (long)iVar6;
      local_240.m_value = 6;
      local_210.m_value = 0;
      vStack_208.m_value = 0;
      local_258[0] = local_1f8;
      local_248 = pdVar11;
      local_238.m_value = lVar20;
      local_230 = pdVar11;
      local_228.m_value = lVar8;
      local_200 = local_220.m_value;
      lVar8 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar17 = iDynTree::MatrixDynSize::cols();
      Eigen::Matrix<double,6,-1,0,6,-1>::
      Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,0>>
                ((Matrix<double,6,_1,0,6,_1> *)local_d8,
                 (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                  *)local_258);
      lVar12 = 0;
      puVar15 = local_d8[0];
      do {
        if (0 < lVar20) {
          lVar18 = 0;
          puVar16 = puVar15;
          do {
            *(undefined8 *)(lVar8 + lVar18 * 8) = *puVar16;
            lVar18 = lVar18 + 1;
            puVar16 = puVar16 + 6;
          } while (lVar20 != lVar18);
        }
        lVar12 = lVar12 + 1;
        puVar15 = puVar15 + 1;
        lVar8 = lVar8 + lVar17 * 8;
      } while (lVar12 != 6);
    }
    free(local_d8[0]);
  }
  return true;
}

Assistant:

bool KinDynComputations::inverseDynamicsInertialParametersRegressor(const Vector6& baseAcc,
                                                                    const VectorDynSize& s_ddot,
                                                                          MatrixDynSize& regressor)
{
    // Needed for using pimpl->m_linkVel
    this->computeFwdKinematics();

    // Convert input base acceleration
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_invDynBaseAcc,toEigen(baseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_invDynBaseAcc = convertInertialAccelerationToBodyFixedAcceleration(baseAcc,pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_invDynBaseAcc = convertMixedAccelerationToBodyFixedAcceleration(baseAcc,
                                                                                 pimpl->m_vel.baseVel(),
                                                                                 pimpl->m_pos.worldBasePos().getRotation());
    }

    // Prepare the vector of generalized proper accs
    pimpl->m_invDynGeneralizedProperAccs.baseAcc() = pimpl->m_invDynBaseAcc;
    toEigen(pimpl->m_invDynGeneralizedProperAccs.baseAcc().getLinearVec3()) =
        toEigen(pimpl->m_invDynBaseAcc.getLinearVec3()) - toEigen(pimpl->m_gravityAccInBaseLinkFrame);
    toEigen(pimpl->m_invDynGeneralizedProperAccs.jointAcc()) = toEigen(s_ddot);

    // Run inverse dynamics
    ForwardAccKinematics(pimpl->m_robot_model,
                         pimpl->m_traversal,
                         pimpl->m_pos,
                         pimpl->m_vel,
                         pimpl->m_invDynGeneralizedProperAccs,
                         pimpl->m_linkVel,
                         pimpl->m_invDynLinkProperAccs);

    // Compute the inverse dynamics regressor, using the absolute frame A as the reference frame in which the base dynamics is expressed
    // (this is done out of convenience because the pimpl->m_linkPos (that contains for each link L the transform A_H_L) is already available
    InverseDynamicsInertialParametersRegressor(pimpl->m_robot_model,
                                               pimpl->m_traversal,
                                               pimpl->m_linkPos,
                                               pimpl->m_linkVel,
                                               pimpl->m_invDynLinkProperAccs,
                                               regressor);

    // Transform the first six rows of the regressor according to the choosen frame velocity representation
    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        int cols = regressor.cols();
        Matrix6x6 B_X_A = pimpl->m_pos.worldBasePos().inverse().asAdjointTransformWrench();
        toEigen(regressor).block(0, 0, 6, cols) =
            toEigen(B_X_A)*toEigen(regressor).block(0, 0, 6, cols);

    }
    else if (pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION)
    {
        // In this case, the first six rows are already with the correct value
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        int cols = regressor.cols();
        Matrix6x6 B_A_X_A = Transform(Rotation::Identity(), pimpl->m_pos.worldBasePos().getPosition()).inverse().asAdjointTransformWrench();
        toEigen(regressor).block(0, 0, 6, cols) =
            toEigen(B_A_X_A)*toEigen(regressor).block(0, 0, 6, cols);
    }

    return true;
}